

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

void regress_poly(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  uint uVar1;
  int iVar2;
  double *x_00;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  
  uVar3 = obj->p - (uint)(obj->intercept == 1);
  if ((int)uVar3 < 1) {
    printf("The Value of p should be greater than or equal to 2");
    exit(1);
  }
  uVar4 = (ulong)obj->N;
  x_00 = (double *)malloc(uVar3 * uVar4 * 8);
  if (0 < (long)uVar4) {
    memcpy(x_00,x,uVar4 * 8);
  }
  if (uVar3 != 1) {
    uVar1 = 2;
    if (2 < (int)uVar3) {
      uVar1 = uVar3;
    }
    uVar3 = 1;
    do {
      iVar2 = obj->N;
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          dVar6 = pow(x[lVar5],(double)(int)(uVar3 + 1));
          x_00[(int)uVar4 + lVar5] = (double)(int)dVar6;
          lVar5 = lVar5 + 1;
          iVar2 = obj->N;
        } while (lVar5 < iVar2);
      }
      uVar4 = (ulong)(uint)((int)uVar4 + iVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  regress(obj,x_00,y,res,varcovar,alpha);
  free(x_00);
  return;
}

Assistant:

void regress_poly(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	int polydeg, i, j, sum;
	double *xx;
	/*
	* Performs polynomial regression of the form
	* Y = B0 + B1 * X + B2 * X^2 + ..... + B(p-1) * X ^(p-1)
	*
	* where p is defined as in regular regression
	* p = Number of dependent variables + Independent Variables
	*
	* For p = 3
	* regress_poly calculates coefficients of
	*
	* Y = B0 + B1 * X + B2 * X^2
	*
	*For more information see the functions regress and reg_init
	*/
	if (obj->intercept == 1) {
		polydeg = obj->p - 1;
	}
	else {
		polydeg = obj->p;
	}


	if (polydeg < 1) {
		printf("The Value of p should be greater than or equal to 2");
		exit(1);
	}

	xx = (double*)malloc(sizeof(double) * obj->N * polydeg);
	for (i = 0; i < obj->N; i++)
		xx[i] = x[i];
	sum = obj->N;
	for (i = 1; i < polydeg; ++i) {
		for (j = 0; j < obj->N; ++j) {
			xx[sum + j] = (int)pow((double)x[j], (double)i + 1.);
		}
		sum += obj->N;
	}
	regress(obj, xx, y, res, varcovar, alpha);

	free(xx);
}